

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HestonLogSpotPathSimulator.cpp
# Opt level: O0

void __thiscall
BroadieKayaScheme::BroadieKayaScheme(BroadieKayaScheme *this,BroadieKayaScheme *broadieKayaScheme)

{
  BroadieKayaScheme *broadieKayaScheme_local;
  BroadieKayaScheme *this_local;
  
  HestonLogSpotPathSimulator::HestonLogSpotPathSimulator
            (&this->super_HestonLogSpotPathSimulator,
             (broadieKayaScheme->super_HestonLogSpotPathSimulator).variancePathSimulator_);
  (this->super_HestonLogSpotPathSimulator).super_PathSimulator._vptr_PathSimulator =
       (_func_int **)&PTR__BroadieKayaScheme_00121b08;
  this->gamma1_ = broadieKayaScheme->gamma1_;
  this->gamma2_ = broadieKayaScheme->gamma2_;
  std::vector<double,_std::allocator<double>_>::vector(&this->k0_,&broadieKayaScheme->k0_);
  std::vector<double,_std::allocator<double>_>::vector(&this->k1_,&broadieKayaScheme->k1_);
  std::vector<double,_std::allocator<double>_>::vector(&this->k2_,&broadieKayaScheme->k2_);
  std::vector<double,_std::allocator<double>_>::vector(&this->k3_,&broadieKayaScheme->k3_);
  std::vector<double,_std::allocator<double>_>::vector(&this->k4_,&broadieKayaScheme->k4_);
  return;
}

Assistant:

BroadieKayaScheme::BroadieKayaScheme(const BroadieKayaScheme& broadieKayaScheme):
        HestonLogSpotPathSimulator(*broadieKayaScheme.variancePathSimulator_),
        gamma1_(broadieKayaScheme.gamma1_), gamma2_(broadieKayaScheme.gamma2_),
        k0_(broadieKayaScheme.k0_), k1_(broadieKayaScheme.k1_),
        k2_(broadieKayaScheme.k2_), k3_(broadieKayaScheme.k3_),
        k4_(broadieKayaScheme.k4_)
{

}